

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2SharingRandomTest::deinit(GLES2SharingRandomTest *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Library *pLVar3;
  TestError *this_00;
  int threadNdx;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar1 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppEVar1 - (long)ppEVar2) >> 3) <= lVar4) break;
    if (ppEVar2[lVar4] != (EGLThread *)0x0) {
      (*(ppEVar2[lVar4]->super_Thread).super_Thread._vptr_Thread[1])();
      ppEVar2 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    ppEVar2[lVar4] = (EGLThread *)0x0;
    lVar4 = lVar4 + 1;
  }
  if (ppEVar1 != ppEVar2) {
    (this->m_threads).
    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar2;
  }
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar3->_vptr_Library[0x34])(pLVar3);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  if (this->m_requiresRestart != true) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"!m_requiresRestart",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x8df);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2SharingRandomTest::deinit (void)
{
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		delete m_threads[threadNdx];
		m_threads[threadNdx] = DE_NULL;
	}

	m_threads.clear();

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_eglDisplay);
		m_eglDisplay = EGL_NO_DISPLAY;
	}

	TCU_CHECK(!m_requiresRestart);
}